

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

bool __thiscall
TargetPropertyEntryFinder::operator()
          (TargetPropertyEntryFinder *this,
          BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *entry)

{
  __normal_iterator<cmSourceFileLocation_*,_std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>_>
  _Var1;
  bool bVar2;
  string_view arg;
  vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> locations;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_> local_48;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  arg._M_str = (entry->Value)._M_dataplus._M_p;
  arg._M_len = (entry->Value)._M_string_length;
  cmExpandedList_abi_cxx11_(&local_28,arg,false);
  local_48.super__Vector_base<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.super__Vector_base<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>._M_impl.
  super__Vector_impl_data._M_finish = (cmSourceFileLocation *)0x0;
  local_48.super__Vector_base<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::reserve
            (&local_48,
             (long)local_28.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_28.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 5);
  std::
  transform<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<cmSourceFileLocation,std::allocator<cmSourceFileLocation>>>,CreateLocation>
            ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_28.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_28.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,&local_48,this->Needle->Makefile);
  _Var1 = std::
          __find_if<__gnu_cxx::__normal_iterator<cmSourceFileLocation*,std::vector<cmSourceFileLocation,std::allocator<cmSourceFileLocation>>>,__gnu_cxx::__ops::_Iter_pred<LocationMatcher>>
                    (local_48.
                     super__Vector_base<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_48.
                     super__Vector_base<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>
                     ._M_impl.super__Vector_impl_data._M_finish,this->Needle);
  bVar2 = _Var1._M_current !=
          local_48.super__Vector_base<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>.
          _M_impl.super__Vector_impl_data._M_finish;
  std::vector<cmSourceFileLocation,_std::allocator<cmSourceFileLocation>_>::~vector(&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_28);
  return bVar2;
}

Assistant:

bool operator()(BT<std::string> const& entry)
  {
    std::vector<std::string> files = cmExpandedList(entry.Value);
    std::vector<cmSourceFileLocation> locations;
    locations.reserve(files.size());
    std::transform(files.begin(), files.end(), std::back_inserter(locations),
                   CreateLocation(this->Needle.GetMakefile()));

    return std::find_if(locations.begin(), locations.end(),
                        LocationMatcher(this->Needle)) != locations.end();
  }